

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_FloodZones(void)

{
  zone_t *pzVar1;
  ReverbContainer *pRVar2;
  uint amount;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (numsectors < 1) {
    amount = 0;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    amount = 0;
    do {
      if (*(short *)((long)sectors->Portals + lVar4 + -0x14) == -1) {
        P_FloodZone((sector_t_conflict *)((long)&sectors->planes[0].xform.xOffs + lVar4),amount);
        amount = amount + 1;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x218;
    } while (lVar5 < numsectors);
  }
  TArray<zone_t,_zone_t>::Resize(&Zones,amount);
  pRVar2 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar2 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar2 = DefaultEnvironments[0];
  }
  pzVar1 = Zones.Array;
  if (0 < (int)amount) {
    uVar3 = 0;
    do {
      pzVar1[uVar3].Environment = pRVar2;
      uVar3 = uVar3 + 1;
    } while (amount != uVar3);
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	Zones.Resize(z);
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		Zones[i].Environment = reverb;
	}
}